

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

size_t __thiscall embree::SceneGraph::SubdivMeshNode::numBytes(SubdivMeshNode *this)

{
  pointer pvVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*(this->super_Node).super_RefCount._vptr_RefCount[0xe])();
  pvVar1 = (this->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return ((long)(this->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish +
          (CONCAT44(extraout_var,iVar2) * 4 -
          (long)(this->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) +
         ((long)(this->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 5) *
         pvVar1->size_active * 0x10;
}

Assistant:

size_t numBytes() const {
        return numPrimitives()*sizeof(unsigned) + numEdges()*sizeof(unsigned) + numPositions()*numTimeSteps()*sizeof(Vertex);
      }